

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O1

void __thiscall
UnitTests::Assert::
RangeEquals<std::_Deque_iterator<long,long&,long*>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,_Deque_iterator<long,_long_&,_long_*> *expected_first,
          _Deque_iterator<long,_long_&,_long_*> *expected_last,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last)

{
  long *plVar1;
  long got_len;
  long *plVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  _Map_pointer pplVar4;
  long expected_len;
  long *plVar5;
  long *plVar6;
  string local_130;
  _Deque_iterator<long,_long_&,_long_*> *local_110;
  _Deque_iterator<long,_long_&,_long_*> *local_108;
  Assert *local_100;
  string *local_f8;
  _Deque_iterator<long,_long_&,_long_*> local_f0;
  _Deque_iterator<long,_long_&,_long_*> local_d0;
  _Deque_iterator<long,_long_&,_long_*> local_b0;
  _Deque_iterator<long,_long_&,_long_*> local_90;
  _Deque_iterator<long,_long_&,_long_*> local_70;
  _Deque_iterator<long,_long_&,_long_*> local_50;
  
  plVar5 = expected_first->_M_cur;
  plVar6 = expected_first->_M_last;
  pplVar4 = expected_first->_M_node;
  plVar1 = expected_last->_M_cur;
  expected_len = ((long)plVar6 - (long)plVar5 >> 3) +
                 ((long)plVar1 - (long)expected_last->_M_first >> 3) +
                 ((((ulong)((long)expected_last->_M_node - (long)pplVar4) >> 3) - 1) +
                 (ulong)(expected_last->_M_node == (_Map_pointer)0x0)) * 0x40;
  got_len = (long)got_last._M_current - (long)got_first._M_current >> 2;
  if (expected_len != got_len) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130," length","");
    local_50._M_cur = expected_first->_M_cur;
    local_50._M_first = expected_first->_M_first;
    local_50._M_last = expected_first->_M_last;
    local_50._M_node = expected_first->_M_node;
    local_90._M_cur = expected_last->_M_cur;
    local_90._M_first = expected_last->_M_first;
    local_90._M_last = expected_last->_M_last;
    local_90._M_node = expected_last->_M_node;
    local_70._M_cur = local_90._M_cur;
    local_70._M_first = local_90._M_first;
    local_70._M_last = local_90._M_last;
    local_70._M_node = local_90._M_node;
    RangeError<std::_Deque_iterator<long,long&,long*>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (this,msg,&local_130,&local_50,&local_70,got_first,got_last,&local_90,expected_len,
               got_len);
  }
  plVar2 = expected_first->_M_first;
  for (_Var3._M_current = got_first._M_current;
      (plVar5 != plVar1 && (*plVar5 == (long)*_Var3._M_current));
      _Var3._M_current = _Var3._M_current + 1) {
    plVar5 = plVar5 + 1;
    if (plVar5 == plVar6) {
      plVar2 = pplVar4[1];
      pplVar4 = pplVar4 + 1;
      plVar6 = plVar2 + 0x40;
      plVar5 = plVar2;
    }
  }
  if (plVar5 == plVar1) {
    return;
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_110 = expected_first;
  local_108 = expected_last;
  local_100 = this;
  local_f8 = msg;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  local_b0._M_cur = local_110->_M_cur;
  local_b0._M_first = local_110->_M_first;
  local_b0._M_last = local_110->_M_last;
  local_b0._M_node = local_110->_M_node;
  local_d0._M_cur = local_108->_M_cur;
  local_d0._M_first = local_108->_M_first;
  local_d0._M_last = local_108->_M_last;
  local_d0._M_node = local_108->_M_node;
  local_f0._M_cur = plVar5;
  local_f0._M_first = plVar2;
  local_f0._M_last = plVar6;
  local_f0._M_node = pplVar4;
  RangeError<std::_Deque_iterator<long,long&,long*>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_100,local_f8,&local_130,&local_b0,&local_d0,got_first,got_last,&local_f0,
             expected_len,got_len);
}

Assistant:

void Equals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (!are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha << "\n";
                s << "    Expected <" << stream_with_coercion(std::common_type_t<T, U>(expected), expected) << ">\n";
                s << "     but got <" << stream_with_coercion(std::common_type_t<T, U>(actual), actual) << ">\n";
                s << "  ";
                Error(s.str());
            }
        }